

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example.cc
# Opt level: O2

void __thiscall TC_parser<false>::nameSpace(TC_parser<false> *this)

{
  char cVar1;
  char *pos;
  example *this_00;
  uint64_t uVar2;
  
  this->cur_channel_v = 1.0;
  this->index = '\0';
  this->new_index = false;
  this->anon = 0;
  pos = this->reading_head;
  cVar1 = *pos;
  if ((((cVar1 == '\t') || (cVar1 == ' ')) || (pos == this->endLine)) || (cVar1 == '|')) {
LAB_0022bc78:
    this->index = ' ';
    if ((this->ae->super_example_predict).feature_space[0x20].values._end ==
        (this->ae->super_example_predict).feature_space[0x20].values._begin) {
      this->new_index = true;
    }
    if ((ulong)this->hash_seed == 0) {
      uVar2 = 0;
    }
    else {
      uVar2 = uniform_hash("",0,(ulong)this->hash_seed);
    }
    this->channel_hash = uVar2;
  }
  else {
    if (cVar1 == ':') {
      parserWarning(this,"malformed example! \'|\',String,space, or EOL expected after : \"",
                    this->beginLine,pos,"\"");
      goto LAB_0022bcbd;
    }
    if (cVar1 == '\r') goto LAB_0022bc78;
    nameSpaceInfo(this);
  }
  listFeatures(this);
LAB_0022bcbd:
  if ((this->new_index == true) &&
     (this_00 = this->ae,
     (this_00->super_example_predict).feature_space[this->index].values._end !=
     (this_00->super_example_predict).feature_space[this->index].values._begin)) {
    v_array<unsigned_char>::push_back((v_array<unsigned_char> *)this_00,&this->index);
    return;
  }
  return;
}

Assistant:

inline void nameSpace()
  {
    cur_channel_v = 1.0;
    index = 0;
    new_index = false;
    anon = 0;
    if (*reading_head == ' ' || *reading_head == '\t' || reading_head == endLine || *reading_head == '|' ||
        *reading_head == '\r')
    {
      // NameSpace --> ListFeatures
      index = (unsigned char)' ';
      if (ae->feature_space[index].size() == 0)
        new_index = true;
      if (audit)
      {
        if (base != nullptr)
          free(base);
        base = calloc_or_throw<char>(2);
        base[0] = ' ';
        base[1] = '\0';
      }
      channel_hash = this->hash_seed == 0 ? 0 : uniform_hash("", 0, this->hash_seed);
      listFeatures();
    }
    else if (*reading_head != ':')
    {
      // NameSpace --> NameSpaceInfo ListFeatures
      nameSpaceInfo();
      listFeatures();
    }
    else
    {
      // syntax error
      parserWarning("malformed example! '|',String,space, or EOL expected after : \"", beginLine, reading_head, "\"");
    }
    if (new_index && ae->feature_space[index].size() > 0)
      ae->indices.push_back(index);
  }